

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O1

void __thiscall Lodtalk::SpecialRuntimeObjects::registerGCRoots(SpecialRuntimeObjects *this)

{
  Oop *pOVar1;
  MemoryManager *this_00;
  GarbageCollector *this_01;
  
  this_00 = VMContext::getMemoryManager(this->context);
  this_01 = MemoryManager::getGarbageCollector(this_00);
  pOVar1 = (this->specialObjectTable).
           super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
           super__Vector_impl_data._M_start;
  GarbageCollector::registerGCRoot
            (this_01,pOVar1,
             (long)(this->specialObjectTable).
                   super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pOVar1 >> 3);
  pOVar1 = (Oop *)(this->specialClassTable).
                  super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  GarbageCollector::registerGCRoot
            (this_01,pOVar1,
             (long)(this->specialClassTable).
                   super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 3);
  GarbageCollector::registerNativeObject(this_01,(Oop)&NilObject);
  GarbageCollector::registerNativeObject(this_01,(Oop)&TrueObject);
  GarbageCollector::registerNativeObject(this_01,(Oop)&FalseObject);
  return;
}

Assistant:

void SpecialRuntimeObjects::registerGCRoots()
{
    auto gc = context->getMemoryManager()->getGarbageCollector();

    // Register the runtime GC  objects table.
	gc->registerGCRoot(&specialObjectTable[0], specialObjectTable.size());

	// Register the special classes table.
	gc->registerGCRoot((Oop*)&specialClassTable[0], specialClassTable.size());

    // nil, true, false
    gc->registerNativeObject(nilOop());
    gc->registerNativeObject(trueOop());
    gc->registerNativeObject(falseOop());
}